

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.hpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
primesum::generate_prime_sums<unsigned_long>(int64_t max)

{
  initializer_list<unsigned_long> __l;
  size_type sVar1;
  reference pvVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  uint64_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *primes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff88;
  value_type vVar3;
  uint64_t in_stack_ffffffffffffff90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  undefined8 local_50;
  allocator_type *in_stack_ffffffffffffffb8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffc0;
  iterator in_stack_ffffffffffffffc8;
  size_type sVar4;
  
  sVar4 = 0;
  this = in_RDI;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x12e5fb);
  __l._M_len = sVar4;
  __l._M_array = in_stack_ffffffffffffffc8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_ffffffffffffffc0,__l,in_stack_ffffffffffffffb8);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x12e620);
  primesieve::generate_primes<unsigned_long>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_50 = 1;
  while (sVar4 = local_50,
        sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this),
        sVar4 < sVar1) {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (this,local_50 - 1);
    vVar3 = *pvVar2;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this,local_50);
    *pvVar2 = vVar3 + *pvVar2;
    local_50 = local_50 + 1;
  }
  return in_RDI;
}

Assistant:

std::vector<T> generate_prime_sums(int64_t max)
{
  std::vector<T> primes = { 0 };
  primesieve::generate_primes(max, &primes);

  for (uint64_t i = 1; i < primes.size(); i++)
    primes[i] += primes[i - 1];

  return primes;
}